

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

char __thiscall
Fl_Preferences::get(Fl_Preferences *this,char *key,char *text,char *defaultValue,int maxSize)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = Node::get(this->node,key);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = defaultValue;
    if (defaultValue == (char *)0x0) {
      *text = '\0';
      pcVar1 = (char *)0x0;
      goto LAB_0018ac35;
    }
  }
  else {
    pcVar2 = strchr(pcVar1,0x5c);
    if (pcVar2 != (char *)0x0) {
      pcVar1 = decodeText(pcVar1);
      fl_strlcpy(text,pcVar1,(long)maxSize);
      free(pcVar1);
      return '\x01';
    }
  }
  fl_strlcpy(text,pcVar1,(long)maxSize);
LAB_0018ac35:
  return pcVar1 != defaultValue;
}

Assistant:

char Fl_Preferences::get( const char *key, char *text, const char *defaultValue, int maxSize ) {
  const char *v = node->get( key );
  if ( v && strchr( v, '\\' ) ) {
    char *w = decodeText( v );
    strlcpy(text, w, maxSize);
    free( w );
    return 1;
  }
  if ( !v ) v = defaultValue;
  if ( v ) strlcpy(text, v, maxSize);
  else *text = 0;
  return ( v != defaultValue );
}